

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpackutil.c
# Opt level: O0

int fits_read_image_speed
              (fitsfile *infptr,float *whole_elapse,float *whole_cpu,float *row_elapse,
              float *row_cpu,int *status)

{
  int iVar1;
  undefined8 local_1d8;
  double dnull;
  double *darray;
  float filesize;
  float enull;
  float *earray;
  long inc [9];
  long local_168;
  long lpixel [9];
  undefined1 local_118 [8];
  long fpixel [9];
  long local_c8;
  long naxes [9];
  long ii;
  void *pvStack_70;
  int inull;
  int *iarray;
  int anynull;
  int naxis;
  int bitpix;
  short snull;
  short *sarray;
  void *pvStack_48;
  uchar cnull;
  uchar *carray;
  int *status_local;
  float *row_cpu_local;
  float *row_elapse_local;
  float *whole_cpu_local;
  float *whole_elapse_local;
  fitsfile *infptr_local;
  
  sarray._7_1_ = 0;
  naxis._2_2_ = 0;
  ii._4_4_ = 0;
  carray = (uchar *)status;
  status_local = (int *)row_cpu;
  row_cpu_local = row_elapse;
  row_elapse_local = whole_cpu;
  whole_cpu_local = whole_elapse;
  whole_elapse_local = (float *)infptr;
  memcpy(local_118,&DAT_0010c260,0x48);
  memcpy(&local_168,&DAT_0010c2b0,0x48);
  memcpy(&earray,&DAT_0010c300,0x48);
  darray._4_4_ = 0;
  local_1d8 = 0;
  if (*(int *)carray == 0) {
    ffgipr(whole_elapse_local,9,&anynull,(long)&iarray + 4,&local_c8,carray);
    if (iarray._4_4_ == 2) {
      local_168 = local_c8;
      lpixel[0] = naxes[0];
      iVar1 = anynull;
      if (anynull < 1) {
        iVar1 = -anynull;
      }
      darray._0_4_ = (float)(((double)(local_c8 * iVar1) / 8000000.0) * (double)naxes[0]);
      ffpscl(0x3ff0000000000000,0,whole_elapse_local,carray);
      *whole_cpu_local = 0.0;
      *row_elapse_local = 0.0;
      if (anynull == 8) {
        pvStack_48 = calloc(naxes[0] * local_c8,1);
        marktime((int *)carray);
        ffgsv(whole_elapse_local,0xb,local_118,&local_168,&earray,(long)&sarray + 7,pvStack_48,
              &iarray,carray);
        gettime(whole_cpu_local,row_elapse_local,(int *)carray);
        if (row_cpu_local != (float *)0x0) {
          marktime((int *)carray);
          for (naxes[8] = 0; naxes[8] < naxes[0]; naxes[8] = naxes[8] + 1) {
            fpixel[0] = naxes[8] + 1;
            ffgpxv(whole_elapse_local,0xb,local_118,local_c8,(long)&sarray + 7,pvStack_48,&iarray,
                   carray);
          }
          gettime(row_cpu_local,(float *)status_local,(int *)carray);
        }
        free(pvStack_48);
      }
      else if (anynull == 0x10) {
        _bitpix = calloc(local_c8 * naxes[0],2);
        marktime((int *)carray);
        ffgsv(whole_elapse_local,0x15,local_118,&local_168,&earray,(long)&naxis + 2,_bitpix,&iarray,
              carray);
        gettime(whole_cpu_local,row_elapse_local,(int *)carray);
        if (row_cpu_local != (float *)0x0) {
          marktime((int *)carray);
          for (naxes[8] = 0; naxes[8] < naxes[0]; naxes[8] = naxes[8] + 1) {
            fpixel[0] = naxes[8] + 1;
            ffgpxv(whole_elapse_local,0x15,local_118,local_c8,(long)&naxis + 2,_bitpix,&iarray,
                   carray);
          }
          gettime(row_cpu_local,(float *)status_local,(int *)carray);
        }
        free(_bitpix);
      }
      else if (anynull == 0x20) {
        pvStack_70 = calloc(local_c8 * naxes[0],4);
        marktime((int *)carray);
        ffgsv(whole_elapse_local,0x1f,local_118,&local_168,&earray,(long)&ii + 4,pvStack_70,&iarray,
              carray);
        gettime(whole_cpu_local,row_elapse_local,(int *)carray);
        if (row_cpu_local != (float *)0x0) {
          marktime((int *)carray);
          for (naxes[8] = 0; naxes[8] < naxes[0]; naxes[8] = naxes[8] + 1) {
            fpixel[0] = naxes[8] + 1;
            ffgpxv(whole_elapse_local,0x1f,local_118,local_c8,(long)&ii + 4,pvStack_70,&iarray,
                   carray);
          }
          gettime(row_cpu_local,(float *)status_local,(int *)carray);
        }
        free(pvStack_70);
      }
      else if (anynull == -0x20) {
        _filesize = calloc(naxes[0] * local_c8,4);
        marktime((int *)carray);
        ffgsv(whole_elapse_local,0x2a,local_118,&local_168,&earray,(long)&darray + 4,_filesize,
              &iarray,carray);
        gettime(whole_cpu_local,row_elapse_local,(int *)carray);
        if (row_cpu_local != (float *)0x0) {
          marktime((int *)carray);
          for (naxes[8] = 0; naxes[8] < naxes[0]; naxes[8] = naxes[8] + 1) {
            fpixel[0] = naxes[8] + 1;
            ffgpxv(whole_elapse_local,0x2a,local_118,local_c8,(long)&darray + 4,_filesize,&iarray,
                   carray);
          }
          gettime(row_cpu_local,(float *)status_local,(int *)carray);
        }
        free(_filesize);
      }
      else if (anynull == -0x40) {
        dnull = (double)calloc(naxes[0] * local_c8,8);
        marktime((int *)carray);
        ffgsv(whole_elapse_local,0x52,local_118,&local_168,&earray,&local_1d8,dnull,&iarray,carray);
        gettime(whole_cpu_local,row_elapse_local,(int *)carray);
        if (row_cpu_local != (float *)0x0) {
          marktime((int *)carray);
          for (naxes[8] = 0; naxes[8] < naxes[0]; naxes[8] = naxes[8] + 1) {
            fpixel[0] = naxes[8] + 1;
            ffgpxv(whole_elapse_local,0x52,local_118,local_c8,&local_1d8,dnull,&iarray,carray);
          }
          gettime(row_cpu_local,(float *)status_local,(int *)carray);
        }
        free((void *)dnull);
      }
      if (whole_cpu_local != (float *)0x0) {
        *whole_cpu_local = *whole_cpu_local / darray._0_4_;
      }
      if (row_cpu_local != (float *)0x0) {
        *row_cpu_local = *row_cpu_local / darray._0_4_;
      }
      if (row_elapse_local != (float *)0x0) {
        *row_elapse_local = *row_elapse_local / darray._0_4_;
      }
      if (status_local != (int *)0x0) {
        *status_local = (int)((float)*status_local / darray._0_4_);
      }
      infptr_local._4_4_ = *(int *)carray;
    }
    else {
      infptr_local._4_4_ = *(int *)carray;
    }
  }
  else {
    infptr_local._4_4_ = *(int *)carray;
  }
  return infptr_local._4_4_;
}

Assistant:

int fits_read_image_speed (fitsfile *infptr, float *whole_elapse, 
    float *whole_cpu, float *row_elapse, float *row_cpu, int *status)
{
        unsigned char *carray, cnull = 0;
	short *sarray, snull=0;
	int bitpix, naxis, anynull, *iarray, inull = 0;
	long ii, naxes[9], fpixel[9]={1,1,1,1,1,1,1,1,1}, lpixel[9]={1,1,1,1,1,1,1,1,1};
	long inc[9]={1,1,1,1,1,1,1,1,1} ;
	float *earray, enull = 0, filesize;
	double *darray, dnull = 0;
	
	if (*status) return(*status);

	fits_get_img_param (infptr, 9, &bitpix, &naxis, naxes, status);

	if (naxis != 2)return(*status);
	
	lpixel[0] = naxes[0];
	lpixel[1] = naxes[1];
	
        /* filesize in MB */
	filesize = (float) (naxes[0] * abs(bitpix) / 8000000. * naxes[1]);

	/* measure time required to read the raw image */
	fits_set_bscale(infptr, 1.0, 0.0, status);
	*whole_elapse = 0.;
	*whole_cpu = 0;

        if (bitpix == BYTE_IMG) {
		carray = calloc(naxes[1]*naxes[0], sizeof(char));

                /* remove any cached uncompressed tile 
		  (dangerous to directly modify the structure!) */
         /*       (infptr->Fptr)->tilerow = 0; */

		marktime(status);
		fits_read_subset(infptr, TBYTE, fpixel, lpixel, inc, &cnull, 
		      carray, &anynull, status);
		
		/* get elapsped times */
		gettime(whole_elapse, whole_cpu, status);

		/* now read the image again, row by row */
		if (row_elapse) {

                  /* remove any cached uncompressed tile 
	  	    (dangerous to directly modify the structure!) */
          /*        (infptr->Fptr)->tilerow = 0; */

		  marktime(status);
		  for (ii = 0; ii < naxes[1]; ii++) {
		   fpixel[1] = ii+1;
		   fits_read_pix(infptr, TBYTE, fpixel, naxes[0], &cnull, 
		      carray, &anynull, status);
		   }
		   /* get elapsped times */
		   gettime(row_elapse, row_cpu, status);
		}
 		free(carray);
 
	} else if (bitpix == SHORT_IMG) {
		sarray = calloc(naxes[0]*naxes[1], sizeof(short));

		marktime(status);
		fits_read_subset(infptr, TSHORT, fpixel, lpixel, inc, &snull, 
		      sarray, &anynull, status);

		gettime(whole_elapse, whole_cpu, status);   /* get elapsped times */

		/* now read the image again, row by row */
		if (row_elapse) {
		  marktime(status);
		  for (ii = 0; ii < naxes[1]; ii++) {

		   fpixel[1] = ii+1;
		   fits_read_pix(infptr, TSHORT, fpixel, naxes[0], &snull, 
		      sarray, &anynull, status);
		  }
		  /* get elapsped times */
		  gettime(row_elapse, row_cpu, status);
		}

		free(sarray);	

	} else if (bitpix == LONG_IMG) {
		iarray = calloc(naxes[0]*naxes[1], sizeof(int));

		marktime(status);

		fits_read_subset(infptr, TINT, fpixel, lpixel, inc, &inull, 
		      iarray, &anynull, status);
		
		/* get elapsped times */
		gettime(whole_elapse, whole_cpu, status);


		/* now read the image again, row by row */
		if (row_elapse) {
		  marktime(status);
		  for (ii = 0; ii < naxes[1]; ii++) {
		   fpixel[1] = ii+1;
		   fits_read_pix(infptr, TINT, fpixel, naxes[0], &inull, 
		      iarray, &anynull, status);
		  }
		  /* get elapsped times */
		  gettime(row_elapse, row_cpu, status);
		}


 		free(iarray);	

	} else if (bitpix == FLOAT_IMG)   {
		earray = calloc(naxes[1]*naxes[0], sizeof(float));

		marktime(status);

		fits_read_subset(infptr, TFLOAT, fpixel, lpixel, inc, &enull, 
		      earray, &anynull, status);
		
		/* get elapsped times */
		gettime(whole_elapse, whole_cpu, status);

		/* now read the image again, row by row */
		if (row_elapse) {
		  marktime(status);
		  for (ii = 0; ii < naxes[1]; ii++) {
		   fpixel[1] = ii+1;
		   fits_read_pix(infptr, TFLOAT, fpixel, naxes[0], &enull, 
		      earray, &anynull, status);
		  }
		  /* get elapsped times */
		  gettime(row_elapse, row_cpu, status);
		}

 		free(earray);	

	} else if (bitpix == DOUBLE_IMG)  {
		darray = calloc(naxes[1]*naxes[0], sizeof(double));

		marktime(status);

		fits_read_subset(infptr, TDOUBLE, fpixel, lpixel, inc, &dnull, 
		      darray, &anynull, status);
		
		/* get elapsped times */
		gettime(whole_elapse, whole_cpu, status);

		/* now read the image again, row by row */
		if (row_elapse) {
		  marktime(status);
		  for (ii = 0; ii < naxes[1]; ii++) {
		   fpixel[1] = ii+1;
		   fits_read_pix(infptr, TDOUBLE, fpixel, naxes[0], &dnull, 
		      darray, &anynull, status);
		  }
		  /* get elapsped times */
		  gettime(row_elapse, row_cpu, status);
		}

		free(darray);
	}

        if (whole_elapse) *whole_elapse = *whole_elapse / filesize;
        if (row_elapse)   *row_elapse   = *row_elapse / filesize;
        if (whole_cpu)    *whole_cpu    = *whole_cpu / filesize;
        if (row_cpu)      *row_cpu      = *row_cpu / filesize;

	return(*status);
}